

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O0

void Acb_NtkPushLogic(Acb_Ntk_t *p,int nLutSize,int fVerbose)

{
  int iVar1;
  int iVar2;
  Acb_ObjType_t AVar3;
  uint local_28;
  int nPushes;
  int nNodes;
  int iObj;
  int n;
  int fVerbose_local;
  int nLutSize_local;
  Acb_Ntk_t *p_local;
  
  iVar1 = Acb_NtkNodeNum(p);
  local_28 = 0;
  Acb_NtkCreateFanout(p);
  for (nPushes = 1; iVar2 = Vec_StrSize(&p->vObjType), nPushes < iVar2; nPushes = nPushes + 1) {
    AVar3 = Acb_ObjType(p,nPushes);
    if (((AVar3 != ABC_OPER_NONE) && (iVar2 = Acb_ObjIsCio(p,nPushes), iVar2 == 0)) &&
       (iVar2 = Acb_ObjFaninNum(p,nPushes), iVar2 == 0)) {
      Acb_ObjRemoveConst(p,nPushes);
    }
  }
  for (nPushes = 1; iVar2 = Vec_StrSize(&p->vObjType), nPushes < iVar2; nPushes = nPushes + 1) {
    AVar3 = Acb_ObjType(p,nPushes);
    if (((AVar3 != ABC_OPER_NONE) && (iVar2 = Acb_ObjIsCio(p,nPushes), iVar2 == 0)) &&
       (iVar2 = Acb_ObjFaninNum(p,nPushes), iVar2 == 1)) {
      Acb_ObjRemoveBufInv(p,nPushes);
    }
  }
  for (nNodes = 2; nNodes <= nLutSize; nNodes = nNodes + 1) {
    for (nPushes = 1; iVar2 = Vec_StrSize(&p->vObjType), nPushes < iVar2; nPushes = nPushes + 1) {
      AVar3 = Acb_ObjType(p,nPushes);
      if (((AVar3 != ABC_OPER_NONE) && (iVar2 = Acb_ObjIsCio(p,nPushes), iVar2 == 0)) &&
         (iVar2 = Acb_ObjFaninNum(p,nPushes), iVar2 == nNodes)) {
        while (iVar2 = Acb_ObjPushToFanins(p,nPushes,nLutSize), iVar2 != 0) {
          local_28 = local_28 + 1;
        }
        iVar2 = Acb_ObjFaninNum(p,nPushes);
        if (iVar2 == 1) {
          Acb_ObjRemoveBufInv(p,nPushes);
        }
      }
    }
  }
  iVar2 = Acb_NtkNodeNum(p);
  printf("Saved %d nodes after %d pushes.\n",(ulong)(uint)(iVar1 - iVar2),(ulong)local_28);
  return;
}

Assistant:

void Acb_NtkPushLogic( Acb_Ntk_t * p, int nLutSize, int fVerbose )
{
    int n = 0, iObj, nNodes = Acb_NtkNodeNum(p), nPushes = 0;
    Acb_NtkCreateFanout( p );  // fanout data structure
    Acb_NtkForEachNodeSupp( p, iObj, 0 )
        Acb_ObjRemoveConst( p, iObj );
    Acb_NtkForEachNodeSupp( p, iObj, 1 )
        Acb_ObjRemoveBufInv( p, iObj );
    for ( n = 2; n <= nLutSize; n++ )
        Acb_NtkForEachNodeSupp( p, iObj, n )
        {
            while ( Acb_ObjPushToFanins(p, iObj, nLutSize) )
                nPushes++;
            if ( Acb_ObjFaninNum(p, iObj) == 1 )
                Acb_ObjRemoveBufInv( p, iObj );
        }
    printf( "Saved %d nodes after %d pushes.\n", nNodes - Acb_NtkNodeNum(p), nPushes );
}